

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

aiNode * ImportNode(aiScene *pScene,Asset *r,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *meshOffsets,
                   Ref<glTF2::Node> *ptr)

{
  value_type vVar1;
  uint uVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  long lVar5;
  undefined1 auVar6 [16];
  Ref<glTF2::Node> *meshOffsets_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r_00;
  Asset *pScene_00;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  aiNode *paVar11;
  size_type sVar12;
  ulong uVar13;
  aiNode **ppaVar14;
  reference pvVar15;
  reference pvVar16;
  reference pvVar17;
  uint *puVar18;
  Skin *pSVar19;
  pointer paVar20;
  Mesh *pMVar21;
  reference primitive;
  Accessor *this;
  aiVertexWeight this_00;
  Node *pNVar22;
  aiVertexWeight *paVar23;
  aiVertexWeight *__src;
  Light *pLVar24;
  aiMetadata *paVar25;
  aiVertexWeight *local_210;
  aiVertexWeight *local_1e8;
  allocator local_139;
  string local_138;
  uint local_118;
  int local_114;
  uint j;
  int k;
  vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *weights;
  char local_e8 [8];
  char postfix [10];
  Ref<glTF2::Node> joint;
  aiBone *bone;
  float (*pafStack_b8) [16];
  uint32_t i_1;
  mat4 *pbindMatrices;
  undefined1 local_a8 [8];
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  weighting;
  aiMesh *mesh;
  int primitiveNo;
  int count;
  int mesh_idx;
  aiNode *child;
  uint i;
  string local_58;
  aiNode *local_38;
  aiNode *ainode;
  Node *node;
  Ref<glTF2::Node> *ptr_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *meshOffsets_local;
  Asset *r_local;
  aiScene *pScene_local;
  
  node = (Node *)ptr;
  ptr_local = (Ref<glTF2::Node> *)meshOffsets;
  meshOffsets_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)r;
  r_local = (Asset *)pScene;
  ainode = (aiNode *)glTF2::Ref<glTF2::Node>::operator*(ptr);
  paVar11 = (aiNode *)operator_new(0x478);
  GetNodeName_abi_cxx11_(&local_58,(Node *)ainode);
  aiNode::aiNode(paVar11,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_38 = paVar11;
  bVar7 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::empty
                    ((vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> *)
                     ((ainode->mName).data + 0x4c));
  if (!bVar7) {
    sVar12 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::size
                       ((vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                         *)((ainode->mName).data + 0x4c));
    local_38->mNumChildren = (uint)sVar12;
    auVar6 = ZEXT416(local_38->mNumChildren) * ZEXT816(8);
    uVar13 = auVar6._0_8_;
    if (auVar6._8_8_ != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    ppaVar14 = (aiNode **)operator_new__(uVar13);
    local_38->mChildren = ppaVar14;
    for (child._4_4_ = 0; pScene_00 = r_local, r_00 = meshOffsets_local, meshOffsets_00 = ptr_local,
        child._4_4_ < local_38->mNumChildren; child._4_4_ = child._4_4_ + 1) {
      pvVar15 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
                operator[]((vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                            *)((ainode->mName).data + 0x4c),(ulong)child._4_4_);
      paVar11 = ImportNode((aiScene *)pScene_00,(Asset *)r_00,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)meshOffsets_00,
                           pvVar15);
      paVar11->mParent = local_38;
      local_38->mChildren[child._4_4_] = paVar11;
    }
  }
  GetNodeTransform(&local_38->mTransformation,(Node *)ainode);
  bVar7 = std::vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>::empty
                    ((vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_> *)
                     ((ainode->mName).data + 100));
  if (!bVar7) {
    sVar12 = std::vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>::size
                       ((vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                         *)((ainode->mName).data + 100));
    if (sVar12 != 1) {
      __assert_fail("node.meshes.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF2/glTF2Importer.cpp"
                    ,0x375,
                    "aiNode *ImportNode(aiScene *, glTF2::Asset &, std::vector<unsigned int> &, glTF2::Ref<glTF2::Node> &)"
                   );
    }
    pvVar16 = std::vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>::
              operator[]((vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                          *)((ainode->mName).data + 100),0);
    uVar8 = glTF2::Ref<glTF2::Mesh>::GetIndex(pvVar16);
    pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ptr_local,
                         (long)(int)(uVar8 + 1));
    vVar1 = *pvVar17;
    pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ptr_local,
                         (long)(int)uVar8);
    uVar9 = vVar1 - *pvVar17;
    local_38->mNumMeshes = uVar9;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)(int)uVar9;
    uVar13 = SUB168(auVar6 * ZEXT816(4),0);
    if (SUB168(auVar6 * ZEXT816(4),8) != 0) {
      uVar13 = 0xffffffffffffffff;
    }
    puVar18 = (uint *)operator_new__(uVar13);
    local_38->mMeshes = puVar18;
    bVar7 = glTF2::Ref::operator_cast_to_bool((Ref *)((ainode->mName).data + 300));
    if (bVar7) {
      for (mesh._4_4_ = 0; mesh._4_4_ < (int)uVar9; mesh._4_4_ = mesh._4_4_ + 1) {
        sVar3 = (r_local->mCurrentAssetDir).field_2._M_allocated_capacity;
        pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ptr_local,
                             (long)(int)uVar8);
        weighting.
        super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)(sVar3 + (ulong)(*pvVar17 + mesh._4_4_) * 8);
        pSVar19 = glTF2::Ref<glTF2::Skin>::operator->
                            ((Ref<glTF2::Skin> *)((ainode->mName).data + 300));
        sVar12 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::
                 size(&pSVar19->jointNames);
        *(int *)&weighting.
                 super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                 super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
                 super__Vector_impl_data._M_start = (int)sVar12;
        paVar20 = (pointer)operator_new__((ulong)*(uint *)&weighting.
                                                                                                                      
                                                  super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  [9].
                                                  super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                                  ._M_impl.super__Vector_impl_data._M_start << 3);
        weighting.
        super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
        super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
        super__Vector_impl_data._M_finish = paVar20;
        uVar2 = *(uint *)&weighting.
                          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                          super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>::allocator
                  ((allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                   ((long)&pbindMatrices + 7));
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                  *)local_a8,(ulong)uVar2,
                 (allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                 ((long)&pbindMatrices + 7));
        std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>::~allocator
                  ((allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                   ((long)&pbindMatrices + 7));
        pvVar16 = std::vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>::
                  operator[]((vector<glTF2::Ref<glTF2::Mesh>,_std::allocator<glTF2::Ref<glTF2::Mesh>_>_>
                              *)((ainode->mName).data + 100),0);
        pMVar21 = glTF2::Ref<glTF2::Mesh>::operator->(pvVar16);
        primitive = std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::
                    operator[](&pMVar21->primitives,(long)mesh._4_4_);
        BuildVertexWeightMapping
                  (primitive,
                   (vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    *)local_a8);
        pafStack_b8 = (float (*) [16])0x0;
        pSVar19 = glTF2::Ref<glTF2::Skin>::operator->
                            ((Ref<glTF2::Skin> *)((ainode->mName).data + 300));
        this = glTF2::Ref<glTF2::Accessor>::operator->(&pSVar19->inverseBindMatrices);
        glTF2::Accessor::ExtractData<float[16]>(this,&stack0xffffffffffffff48);
        for (bone._4_4_ = 0;
            bone._4_4_ <
            *(uint *)&weighting.
                      super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
                      super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
                      super__Vector_impl_data._M_start; bone._4_4_ = bone._4_4_ + 1) {
          this_00 = (aiVertexWeight)operator_new(0x450);
          aiBone::aiBone((aiBone *)this_00);
          pSVar19 = glTF2::Ref<glTF2::Skin>::operator->
                              ((Ref<glTF2::Skin> *)((ainode->mName).data + 300));
          pvVar15 = std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                    ::operator[](&pSVar19->jointNames,(ulong)bone._4_4_);
          unique0x100005f6 = pvVar15->vector;
          glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)(postfix + 8));
          uVar13 = std::__cxx11::string::empty();
          if ((uVar13 & 1) == 0) {
            pNVar22 = glTF2::Ref<glTF2::Node>::operator->((Ref<glTF2::Node> *)(postfix + 8));
            aiString::operator=((aiString *)this_00,&(pNVar22->super_Object).name);
          }
          else {
            if ((ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                 ::kDefaultName_abi_cxx11_ == '\0') &&
               (iVar10 = __cxa_guard_acquire(&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                                              ::kDefaultName_abi_cxx11_), iVar10 != 0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)
                         &ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                          ::kDefaultName_abi_cxx11_,"bone_",(allocator *)(postfix + 7));
              std::allocator<char>::~allocator((allocator<char> *)(postfix + 7));
              __cxa_atexit(std::__cxx11::string::~string,
                           &ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                            ::kDefaultName_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                                   ::kDefaultName_abi_cxx11_);
            }
            postfix[0] = '\0';
            postfix[1] = '\0';
            local_e8[0] = '\0';
            local_e8[1] = '\0';
            local_e8[2] = '\0';
            local_e8[3] = '\0';
            local_e8[4] = '\0';
            local_e8[5] = '\0';
            local_e8[6] = '\0';
            local_e8[7] = '\0';
            Assimp::ASSIMP_itoa10<10ul>((char (*) [10])local_e8,bone._4_4_);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &weights,&ImportNode(aiScene*,glTF2::Asset&,std::vector<unsigned_int,std::allocator<unsigned_int>>&,glTF2::Ref<glTF2::Node>&)
                                     ::kDefaultName_abi_cxx11_,local_e8);
            aiString::operator=((aiString *)this_00,(string *)&weights);
            std::__cxx11::string::~string((string *)&weights);
          }
          pNVar22 = glTF2::Ref<glTF2::Node>::operator*((Ref<glTF2::Node> *)(postfix + 8));
          GetNodeTransform((aiMatrix4x4 *)((long)this_00 + 0x410),pNVar22);
          glTFCommon::CopyValue(pafStack_b8 + bone._4_4_,(aiMatrix4x4 *)((long)this_00 + 0x410));
          _j = std::
               vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
               ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                             *)local_a8,(ulong)bone._4_4_);
          sVar12 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size(_j);
          *(uint *)((long)this_00 + 0x404) = (uint)sVar12;
          if (*(uint *)((long)this_00 + 0x404) == 0) {
            paVar23 = (aiVertexWeight *)operator_new__(8);
            local_210 = paVar23;
            do {
              aiVertexWeight::aiVertexWeight(local_210);
              local_210 = local_210 + 1;
            } while (local_210 != paVar23 + 1);
            *(aiVertexWeight **)((long)this_00 + 0x408) = paVar23;
            *(uint *)((long)this_00 + 0x404) = 1;
            (*(aiVertexWeight **)((long)this_00 + 0x408))->mVertexId = 0;
            (*(aiVertexWeight **)((long)this_00 + 0x408))->mWeight = 0.0;
          }
          else {
            uVar13 = (ulong)*(uint *)((long)this_00 + 0x404);
            paVar23 = (aiVertexWeight *)operator_new__(uVar13 << 3);
            if (uVar13 != 0) {
              local_1e8 = paVar23;
              do {
                aiVertexWeight::aiVertexWeight(local_1e8);
                local_1e8 = local_1e8 + 1;
              } while (local_1e8 != paVar23 + uVar13);
            }
            *(aiVertexWeight **)((long)this_00 + 0x408) = paVar23;
            paVar23 = *(aiVertexWeight **)((long)this_00 + 0x408);
            __src = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::data(_j);
            memcpy(paVar23,__src,(ulong)*(uint *)((long)this_00 + 0x404) << 3);
          }
          weighting.
          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage[9].
          super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>._M_impl.
          super__Vector_impl_data._M_finish[bone._4_4_] = this_00;
        }
        if ((pafStack_b8 != (float (*) [16])0x0) && (pafStack_b8 != (float (*) [16])0x0)) {
          operator_delete__(pafStack_b8);
        }
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                   *)local_a8);
      }
    }
    local_114 = 0;
    pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ptr_local,
                         (long)(int)uVar8);
    for (local_118 = *pvVar17; uVar9 = local_118,
        pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ptr_local,
                             (long)(int)(uVar8 + 1)), uVar9 < *pvVar17; local_118 = local_118 + 1) {
      local_38->mMeshes[local_114] = local_118;
      local_114 = local_114 + 1;
    }
  }
  bVar7 = glTF2::Ref::operator_cast_to_bool((Ref *)((ainode->mName).data + 0xf4));
  paVar11 = local_38;
  if (bVar7) {
    p_Var4 = (r_local->mUsedIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    uVar8 = glTF2::Ref<glTF2::Camera>::GetIndex((Ref<glTF2::Camera> *)((ainode->mName).data + 0xf4))
    ;
    aiString::operator=(*(aiString **)(&p_Var4->_M_color + (ulong)uVar8 * 2),&paVar11->mName);
  }
  bVar7 = glTF2::Ref::operator_cast_to_bool((Ref *)((ainode->mName).data + 0x104));
  paVar11 = local_38;
  if (bVar7) {
    lVar5 = *(long *)&(r_local->mUsedIds)._M_t._M_impl;
    uVar8 = glTF2::Ref<glTF2::Light>::GetIndex((Ref<glTF2::Light> *)((ainode->mName).data + 0x104));
    aiString::operator=(*(aiString **)(lVar5 + (ulong)uVar8 * 8),&paVar11->mName);
    pLVar24 = glTF2::Ref<glTF2::Light>::operator->
                        ((Ref<glTF2::Light> *)((ainode->mName).data + 0x104));
    if (((pLVar24->range).isPresent & 1U) != 0) {
      paVar25 = aiMetadata::Alloc(1);
      local_38->mMetaData = paVar25;
      paVar25 = local_38->mMetaData;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_138,"PBR_LightRange",&local_139);
      pLVar24 = glTF2::Ref<glTF2::Light>::operator->
                          ((Ref<glTF2::Light> *)((ainode->mName).data + 0x104));
      aiMetadata::Set<float>(paVar25,0,&local_138,&(pLVar24->range).value);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
    }
  }
  return local_38;
}

Assistant:

aiNode* ImportNode(aiScene* pScene, glTF2::Asset& r, std::vector<unsigned int>& meshOffsets, glTF2::Ref<glTF2::Node>& ptr)
{
    Node& node = *ptr;

    aiNode* ainode = new aiNode(GetNodeName(node));

    if (!node.children.empty()) {
        ainode->mNumChildren = unsigned(node.children.size());
        ainode->mChildren = new aiNode*[ainode->mNumChildren];

        for (unsigned int i = 0; i < ainode->mNumChildren; ++i) {
            aiNode* child = ImportNode(pScene, r, meshOffsets, node.children[i]);
            child->mParent = ainode;
            ainode->mChildren[i] = child;
        }
    }

    GetNodeTransform(ainode->mTransformation, node);

    if (!node.meshes.empty()) {
        // GLTF files contain at most 1 mesh per node.
        assert(node.meshes.size() == 1);
        int mesh_idx = node.meshes[0].GetIndex();
        int count = meshOffsets[mesh_idx + 1] - meshOffsets[mesh_idx];

        ainode->mNumMeshes = count;
        ainode->mMeshes = new unsigned int[count];

        if (node.skin) {
            for (int primitiveNo = 0; primitiveNo < count; ++primitiveNo) {
                aiMesh* mesh = pScene->mMeshes[meshOffsets[mesh_idx]+primitiveNo];
                mesh->mNumBones = static_cast<unsigned int>(node.skin->jointNames.size());
                mesh->mBones = new aiBone*[mesh->mNumBones];

                // GLTF and Assimp choose to store bone weights differently.
                // GLTF has each vertex specify which bones influence the vertex.
                // Assimp has each bone specify which vertices it has influence over.
                // To convert this data, we first read over the vertex data and pull
                // out the bone-to-vertex mapping.  Then, when creating the aiBones,
                // we copy the bone-to-vertex mapping into the bone.  This is unfortunate
                // both because it's somewhat slow and because, for many applications,
                // we then need to reconvert the data back into the vertex-to-bone
                // mapping which makes things doubly-slow.
                std::vector<std::vector<aiVertexWeight>> weighting(mesh->mNumBones);
                BuildVertexWeightMapping(node.meshes[0]->primitives[primitiveNo], weighting);

                mat4* pbindMatrices = nullptr;
                node.skin->inverseBindMatrices->ExtractData(pbindMatrices);

                for (uint32_t i = 0; i < mesh->mNumBones; ++i) {
                    aiBone* bone = new aiBone();

                    Ref<Node> joint = node.skin->jointNames[i];
                    if (!joint->name.empty()) {
                      bone->mName = joint->name;
                    } else {
                      // Assimp expects each bone to have a unique name.
                      static const std::string kDefaultName = "bone_";
                      char postfix[10] = {0};
                      ASSIMP_itoa10(postfix, i);
                      bone->mName = (kDefaultName + postfix);
                    }
                    GetNodeTransform(bone->mOffsetMatrix, *joint);

                    CopyValue(pbindMatrices[i], bone->mOffsetMatrix);

                    std::vector<aiVertexWeight>& weights = weighting[i];

                    bone->mNumWeights = static_cast<uint32_t>(weights.size());
                    if (bone->mNumWeights > 0) {
                      bone->mWeights = new aiVertexWeight[bone->mNumWeights];
                      memcpy(bone->mWeights, weights.data(), bone->mNumWeights * sizeof(aiVertexWeight));
                    } else {
                      // Assimp expects all bones to have at least 1 weight.
                      bone->mWeights = new aiVertexWeight[1];
                      bone->mNumWeights = 1;
                      bone->mWeights->mVertexId = 0;
                      bone->mWeights->mWeight = 0.f;
                    }
                    mesh->mBones[i] = bone;
                }

                if (pbindMatrices) {
                    delete[] pbindMatrices;
                }
            }
        }

        int k = 0;
        for (unsigned int j = meshOffsets[mesh_idx]; j < meshOffsets[mesh_idx + 1]; ++j, ++k) {
            ainode->mMeshes[k] = j;
        }
    }

    if (node.camera) {
        pScene->mCameras[node.camera.GetIndex()]->mName = ainode->mName;
    }

    if (node.light) {
        pScene->mLights[node.light.GetIndex()]->mName = ainode->mName;

        //range is optional - see https://github.com/KhronosGroup/glTF/tree/master/extensions/2.0/Khronos/KHR_lights_punctual
        //it is added to meta data of parent node, because there is no other place to put it
        if (node.light->range.isPresent)
        {
            ainode->mMetaData = aiMetadata::Alloc(1);
            ainode->mMetaData->Set(0, "PBR_LightRange", node.light->range.value);
        }
    }

    return ainode;
}